

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

void __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::dump(olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
       *this,ostream *os)

{
  ostream *poVar1;
  atomic<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> local_28;
  char local_19;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"olc_db dump, current memory use = ",0x22);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  local_19 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_19,1);
  local_28._M_i.tagged_ptr =
       (basic_node_ptr<unodb::detail::olc_node_header>)(this->root).value._M_i.tagged_ptr;
  detail::
  basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
  ::dump_node(os,&local_28._M_i,true);
  return;
}

Assistant:

void olc_db<Key, Value>::dump(std::ostream& os) const {
#ifdef UNODB_DETAIL_WITH_STATS
  os << "olc_db dump, current memory use = " << get_current_memory_use()
     << '\n';
#else
  os << "olc_db dump\n";
#endif  // UNODB_DETAIL_WITH_STATS
  art_policy::dump_node(os, root.load());
}